

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_lpf2_config *
ma_lpf2_config_init(ma_lpf2_config *__return_storage_ptr__,ma_format format,ma_uint32 channels,
                   ma_uint32 sampleRate,double cutoffFrequency,double q)

{
  if (__return_storage_ptr__ != (ma_lpf2_config *)0x0) {
    *(undefined8 *)&__return_storage_ptr__->sampleRate = 0;
  }
  __return_storage_ptr__->format = format;
  __return_storage_ptr__->channels = channels;
  __return_storage_ptr__->sampleRate = sampleRate;
  __return_storage_ptr__->cutoffFrequency = cutoffFrequency;
  __return_storage_ptr__->q =
       (double)(~-(ulong)(q == 0.0) & (ulong)q | -(ulong)(q == 0.0) & 0x3fe6a09edbf8b9bb);
  return __return_storage_ptr__;
}

Assistant:

MA_API ma_lpf2_config ma_lpf2_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRate, double cutoffFrequency, double q)
{
    ma_lpf2_config config;

    MA_ZERO_OBJECT(&config);
    config.format = format;
    config.channels = channels;
    config.sampleRate = sampleRate;
    config.cutoffFrequency = cutoffFrequency;
    config.q = q;

    /* Q cannot be 0 or else it'll result in a division by 0. In this case just default to 0.707107. */
    if (config.q == 0) {
        config.q = 0.707107;
    }

    return config;
}